

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  byte bVar2;
  BVH *bvh;
  size_t sVar3;
  void *pvVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  vbool<4> vVar17;
  size_t sVar18;
  char cVar19;
  bool bVar20;
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  size_t sVar27;
  NodeRef root;
  ulong uVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  NodeRef *pNVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vfloat4 a0;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  vbool<4> terminated;
  undefined4 local_36e8 [4];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar16 = mm_lookupmask_ps._8_8_;
  uVar15 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar27 = (bvh->root).ptr;
  if (sVar27 != 8) {
    auVar44 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar54 = vpcmpeqd_avx(auVar44,(undefined1  [16])valid_i->field_0);
    auVar44 = *(undefined1 (*) [16])(ray + 0x80);
    auVar34 = ZEXT816(0) << 0x40;
    auVar38 = vcmpps_avx(auVar44,auVar34,5);
    auVar38 = vandps_avx(auVar38,auVar54);
    uVar24 = vmovmskps_avx(auVar38);
    if (uVar24 != 0) {
      uVar25 = (ulong)(uVar24 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar54._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar54._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar54._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar54._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar54 = vfmadd231ps_fma(auVar54,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar56 = vfmadd231ps_fma(auVar54,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar54 = vrsqrtps_avx(auVar56);
      fVar63 = auVar54._0_4_;
      fVar67 = auVar54._4_4_;
      fVar68 = auVar54._8_4_;
      fVar69 = auVar54._12_4_;
      auVar55._0_4_ = fVar63 * fVar63 * fVar63 * auVar56._0_4_ * -0.5;
      auVar55._4_4_ = fVar67 * fVar67 * fVar67 * auVar56._4_4_ * -0.5;
      auVar55._8_4_ = fVar68 * fVar68 * fVar68 * auVar56._8_4_ * -0.5;
      auVar55._12_4_ = fVar69 * fVar69 * fVar69 * auVar56._12_4_ * -0.5;
      auVar70._8_4_ = 0x3fc00000;
      auVar70._0_8_ = 0x3fc000003fc00000;
      auVar70._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar70,auVar54,auVar55);
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      while (uVar25 != 0) {
        lVar26 = 0;
        for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar28 = (ulong)(uint)((int)lVar26 * 4);
        auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar28 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar28 + 0x50)),0x1c);
        auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + uVar28 + 0x60)),0x28);
        fVar63 = *(float *)((long)pre.ray_space + (uVar28 - 0x10));
        auVar78._0_4_ = auVar54._0_4_ * fVar63;
        auVar78._4_4_ = auVar54._4_4_ * fVar63;
        auVar78._8_4_ = auVar54._8_4_ * fVar63;
        auVar78._12_4_ = auVar54._12_4_ * fVar63;
        auVar55 = vshufpd_avx(auVar78,auVar78,1);
        auVar54 = vmovshdup_avx(auVar78);
        auVar83._0_4_ = auVar54._0_4_ ^ 0x80000000;
        auVar54 = vunpckhps_avx(auVar78,auVar34);
        auVar83._4_12_ = ZEXT812(0) << 0x20;
        auVar73 = vshufps_avx(auVar54,auVar83,0x41);
        auVar80._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
        auVar80._8_8_ = auVar55._8_8_ ^ auVar56._8_8_;
        auVar70 = vinsertps_avx(auVar80,auVar78,0x2a);
        auVar54 = vdpps_avx(auVar73,auVar73,0x7f);
        auVar55 = vdpps_avx(auVar70,auVar70,0x7f);
        auVar54 = vcmpps_avx(auVar55,auVar54,1);
        auVar86._0_4_ = auVar54._0_4_;
        auVar86._4_4_ = auVar86._0_4_;
        auVar86._8_4_ = auVar86._0_4_;
        auVar86._12_4_ = auVar86._0_4_;
        auVar54 = vblendvps_avx(auVar70,auVar73,auVar86);
        auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
        auVar70 = vrsqrtss_avx(auVar55,auVar55);
        fVar67 = auVar70._0_4_;
        fVar67 = fVar67 * 1.5 - auVar55._0_4_ * 0.5 * fVar67 * fVar67 * fVar67;
        auVar81._0_4_ = auVar54._0_4_ * fVar67;
        auVar81._4_4_ = auVar54._4_4_ * fVar67;
        auVar81._8_4_ = auVar54._8_4_ * fVar67;
        auVar81._12_4_ = auVar54._12_4_ * fVar67;
        auVar54 = vshufps_avx(auVar81,auVar81,0xc9);
        auVar55 = vshufps_avx(auVar78,auVar78,0xc9);
        auVar87._0_4_ = auVar81._0_4_ * auVar55._0_4_;
        auVar87._4_4_ = auVar81._4_4_ * auVar55._4_4_;
        auVar87._8_4_ = auVar81._8_4_ * auVar55._8_4_;
        auVar87._12_4_ = auVar81._12_4_ * auVar55._12_4_;
        auVar54 = vfmsub231ps_fma(auVar87,auVar78,auVar54);
        auVar70 = vshufps_avx(auVar54,auVar54,0xc9);
        auVar54 = vdpps_avx(auVar70,auVar70,0x7f);
        uVar25 = uVar25 - 1 & uVar25;
        auVar55 = vrsqrtss_avx(auVar54,auVar54);
        fVar67 = auVar55._0_4_;
        fVar67 = fVar67 * 1.5 - auVar54._0_4_ * 0.5 * fVar67 * fVar67 * fVar67;
        auVar84._0_4_ = fVar67 * auVar70._0_4_;
        auVar84._4_4_ = fVar67 * auVar70._4_4_;
        auVar84._8_4_ = fVar67 * auVar70._8_4_;
        auVar84._12_4_ = fVar67 * auVar70._12_4_;
        auVar73._0_4_ = fVar63 * auVar78._0_4_;
        auVar73._4_4_ = fVar63 * auVar78._4_4_;
        auVar73._8_4_ = fVar63 * auVar78._8_4_;
        auVar73._12_4_ = fVar63 * auVar78._12_4_;
        auVar70 = vunpcklps_avx(auVar81,auVar73);
        auVar54 = vunpckhps_avx(auVar81,auVar73);
        auVar73 = vunpcklps_avx(auVar84,auVar34);
        auVar55 = vunpckhps_avx(auVar84,auVar34);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar54,auVar55);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar70,auVar73);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar70,auVar73);
        pre.ray_space[lVar26].vx.field_0 = aVar7;
        pre.ray_space[lVar26].vy.field_0 = aVar5;
        pre.ray_space[lVar26].vz.field_0 = aVar6;
      }
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar54 = vandps_avx(auVar74,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar79._8_4_ = 0x219392ef;
      auVar79._0_8_ = 0x219392ef219392ef;
      auVar79._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar54,auVar79,1);
      auVar34 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar79,auVar54);
      auVar54 = vandps_avx(auVar74,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vcmpps_avx(auVar54,auVar79,1);
      auVar56 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar79,auVar54);
      auVar54 = vandps_avx(auVar74,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar54 = vcmpps_avx(auVar54,auVar79,1);
      auVar54 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar79,auVar54);
      auVar55 = vrcpps_avx(auVar34);
      auVar75._8_4_ = 0x3f800000;
      auVar75._0_8_ = 0x3f8000003f800000;
      auVar75._12_4_ = 0x3f800000;
      auVar34 = vfnmadd213ps_fma(auVar34,auVar55,auVar75);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar34,auVar55,auVar55)
      ;
      auVar34 = vrcpps_avx(auVar56);
      auVar56 = vfnmadd213ps_fma(auVar56,auVar34,auVar75);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar56,auVar34,auVar34)
      ;
      auVar34 = vrcpps_avx(auVar54);
      auVar54 = vfnmadd213ps_fma(auVar54,auVar34,auVar75);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar54,auVar34,auVar34)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar34 = ZEXT416(0) << 0x20;
      auVar54 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar34,1);
      auVar57._8_4_ = 0x20;
      auVar57._0_8_ = 0x2000000020;
      auVar57._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar54,auVar57);
      auVar54 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar34,5);
      auVar58._8_4_ = 0x40;
      auVar58._0_8_ = 0x4000000040;
      auVar58._12_4_ = 0x40;
      auVar64._8_4_ = 0x60;
      auVar64._0_8_ = 0x6000000060;
      auVar64._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar64,auVar58,auVar54);
      auVar54 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar34,5);
      auVar39._8_4_ = 0x80;
      auVar39._0_8_ = 0x8000000080;
      auVar39._12_4_ = 0x80;
      auVar45._8_4_ = 0xa0;
      auVar45._0_8_ = 0xa0000000a0;
      auVar45._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar45,auVar39,auVar54);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar34);
      auVar44 = vmaxps_avx(auVar44,auVar34);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar88 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar54,auVar38);
      auVar34._8_4_ = 0xff800000;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar34,auVar44,auVar38);
      auVar44 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar38._0_4_ ^ auVar44._0_4_;
      terminated.field_0._4_4_ = auVar38._4_4_ ^ auVar44._4_4_;
      terminated.field_0._8_4_ = auVar38._8_4_ ^ auVar44._8_4_;
      terminated.field_0._12_4_ = auVar38._12_4_ ^ auVar44._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar24 = 3;
      }
      else {
        uVar24 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar30 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar27;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_01644ae6:
      do {
        do {
          root.ptr = pNVar30[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0164502e;
          pNVar30 = pNVar30 + -1;
          paVar29 = paVar29 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v;
          auVar89 = ZEXT1664((undefined1  [16])vVar1.field_0);
          auVar44 = vcmpps_avx((undefined1  [16])vVar1.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar21 = vmovmskps_avx(auVar44);
        } while (uVar21 == 0);
        uVar25 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar24 < uVar21) {
LAB_01644b24:
          do {
            vVar17.field_0 = terminated.field_0;
            sVar27 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0164502e;
              auVar44 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar89._0_16_,6);
              if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar44[0xf] < '\0') {
                bVar2 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar4 = This->leafIntersector;
                local_36e8._0_8_ = uVar15;
                local_36e8._8_8_ = uVar16;
                uVar21 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                uVar25 = (ulong)(uVar21 ^ 0xf);
                while (uVar25 != 0) {
                  lVar26 = 0;
                  for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000
                      ) {
                    lVar26 = lVar26 + 1;
                  }
                  uVar25 = uVar25 - 1 & uVar25;
                  cVar19 = (**(code **)((long)pvVar4 + (ulong)bVar2 * 0x40 + 0x18))
                                     (&pre,ray,lVar26,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar88 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  if (cVar19 != '\0') {
                    local_36e8[lVar26] = 0xffffffff;
                  }
                }
                auVar8._8_4_ = local_36e8[2];
                auVar8._12_4_ = local_36e8[3];
                auVar8._0_4_ = local_36e8[0];
                auVar8._4_4_ = local_36e8[1];
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])vVar17.field_0,auVar8);
                auVar44 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar44[0xf]) goto LAB_0164502e;
                auVar43._8_4_ = 0xff800000;
                auVar43._0_8_ = 0xff800000ff800000;
                auVar43._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar43,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_01644ae6;
            }
            uVar25 = root.ptr & 0xfffffffffffffff0;
            auVar44 = auVar88._0_16_;
            for (lVar26 = 0x38;
                (auVar89 = ZEXT1664(auVar44), lVar26 != 0x40 &&
                (sVar3 = *(size_t *)((uVar25 - 0x1c0) + lVar26 * 8), sVar3 != 8));
                lVar26 = lVar26 + 1) {
              if ((root.ptr & 7) == 0) {
                uVar22 = *(undefined4 *)((root.ptr - 0xa0) + lVar26 * 4);
                auVar40._4_4_ = uVar22;
                auVar40._0_4_ = uVar22;
                auVar40._8_4_ = uVar22;
                auVar40._12_4_ = uVar22;
                auVar12._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar12._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar12._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar12._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar42 = vfmsub213ps_fma(auVar40,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar12);
                uVar22 = *(undefined4 *)((root.ptr - 0x60) + lVar26 * 4);
                auVar35._4_4_ = uVar22;
                auVar35._0_4_ = uVar22;
                auVar35._8_4_ = uVar22;
                auVar35._12_4_ = uVar22;
                auVar13._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar13._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar13._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar13._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar37 = vfmsub213ps_fma(auVar35,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar13);
                uVar22 = *(undefined4 *)((root.ptr - 0x20) + lVar26 * 4);
                auVar31._4_4_ = uVar22;
                auVar31._0_4_ = uVar22;
                auVar31._8_4_ = uVar22;
                auVar31._12_4_ = uVar22;
                auVar14._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar14._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar14._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar14._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar33 = vfmsub213ps_fma(auVar31,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar14);
                uVar22 = *(undefined4 *)((root.ptr - 0x80) + lVar26 * 4);
                auVar46._4_4_ = uVar22;
                auVar46._0_4_ = uVar22;
                auVar46._8_4_ = uVar22;
                auVar46._12_4_ = uVar22;
                auVar49 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar12);
                uVar22 = *(undefined4 *)((root.ptr - 0x40) + lVar26 * 4);
                auVar50._4_4_ = uVar22;
                auVar50._0_4_ = uVar22;
                auVar50._8_4_ = uVar22;
                auVar50._12_4_ = uVar22;
                auVar53 = vfmsub213ps_fma(auVar50,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar13);
                uVar22 = *(undefined4 *)(root.ptr + lVar26 * 4);
                auVar59._4_4_ = uVar22;
                auVar59._0_4_ = uVar22;
                auVar59._8_4_ = uVar22;
                auVar59._12_4_ = uVar22;
                auVar62 = vfmsub213ps_fma(auVar59,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar14);
              }
              else {
                uVar22 = *(undefined4 *)((uVar25 - 0x40) + lVar26 * 4);
                auVar60._4_4_ = uVar22;
                auVar60._0_4_ = uVar22;
                auVar60._8_4_ = uVar22;
                auVar60._12_4_ = uVar22;
                uVar22 = *(undefined4 *)((uVar25 - 0x20) + lVar26 * 4);
                auVar51._4_4_ = uVar22;
                auVar51._0_4_ = uVar22;
                auVar51._8_4_ = uVar22;
                auVar51._12_4_ = uVar22;
                uVar22 = *(undefined4 *)(uVar25 + lVar26 * 4);
                auVar47._4_4_ = uVar22;
                auVar47._0_4_ = uVar22;
                auVar47._8_4_ = uVar22;
                auVar47._12_4_ = uVar22;
                fVar63 = *(float *)(uVar25 + 0x20 + lVar26 * 4);
                auVar65._4_4_ = fVar63;
                auVar65._0_4_ = fVar63;
                auVar65._8_4_ = fVar63;
                auVar65._12_4_ = fVar63;
                fVar67 = *(float *)(uVar25 + 0x40 + lVar26 * 4);
                auVar71._4_4_ = fVar67;
                auVar71._0_4_ = fVar67;
                auVar71._8_4_ = fVar67;
                auVar71._12_4_ = fVar67;
                fVar68 = *(float *)(uVar25 + 0x60 + lVar26 * 4);
                auVar76._4_4_ = fVar68;
                auVar76._0_4_ = fVar68;
                auVar76._8_4_ = fVar68;
                auVar76._12_4_ = fVar68;
                uVar22 = *(undefined4 *)(uVar25 + 0x80 + lVar26 * 4);
                auVar41._4_4_ = uVar22;
                auVar41._0_4_ = uVar22;
                auVar41._8_4_ = uVar22;
                auVar41._12_4_ = uVar22;
                uVar22 = *(undefined4 *)(uVar25 + 0xa0 + lVar26 * 4);
                auVar36._4_4_ = uVar22;
                auVar36._0_4_ = uVar22;
                auVar36._8_4_ = uVar22;
                auVar36._12_4_ = uVar22;
                uVar22 = *(undefined4 *)(uVar25 + 0xc0 + lVar26 * 4);
                auVar32._4_4_ = uVar22;
                auVar32._0_4_ = uVar22;
                auVar32._8_4_ = uVar22;
                auVar32._12_4_ = uVar22;
                auVar11._4_4_ = tray.org.field_0._36_4_;
                auVar11._0_4_ = tray.org.field_0._32_4_;
                auVar11._8_4_ = tray.org.field_0._40_4_;
                auVar11._12_4_ = tray.org.field_0._44_4_;
                auVar54 = vfmadd231ps_fma(auVar41,auVar11,auVar65);
                auVar34 = vfmadd231ps_fma(auVar36,auVar11,auVar71);
                auVar56 = vfmadd231ps_fma(auVar32,auVar11,auVar76);
                auVar66._0_4_ = (float)tray.dir.field_0._32_4_ * fVar63;
                auVar66._4_4_ = (float)tray.dir.field_0._36_4_ * fVar63;
                auVar66._8_4_ = (float)tray.dir.field_0._40_4_ * fVar63;
                auVar66._12_4_ = (float)tray.dir.field_0._44_4_ * fVar63;
                auVar72._0_4_ = (float)tray.dir.field_0._32_4_ * fVar67;
                auVar72._4_4_ = (float)tray.dir.field_0._36_4_ * fVar67;
                auVar72._8_4_ = (float)tray.dir.field_0._40_4_ * fVar67;
                auVar72._12_4_ = (float)tray.dir.field_0._44_4_ * fVar67;
                auVar77._0_4_ = fVar68 * (float)tray.dir.field_0._32_4_;
                auVar77._4_4_ = fVar68 * (float)tray.dir.field_0._36_4_;
                auVar77._8_4_ = fVar68 * (float)tray.dir.field_0._40_4_;
                auVar77._12_4_ = fVar68 * (float)tray.dir.field_0._44_4_;
                auVar55 = vfmadd231ps_fma(auVar66,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar60);
                auVar70 = vfmadd231ps_fma(auVar72,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar51);
                auVar73 = vfmadd231ps_fma(auVar77,auVar47,
                                          (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar10._4_4_ = tray.org.field_0._20_4_;
                auVar10._0_4_ = tray.org.field_0._16_4_;
                auVar10._8_4_ = tray.org.field_0._24_4_;
                auVar10._12_4_ = tray.org.field_0._28_4_;
                auVar78 = vfmadd231ps_fma(auVar54,auVar10,auVar60);
                uVar22 = *(undefined4 *)((uVar25 - 0xa0) + lVar26 * 4);
                auVar61._4_4_ = uVar22;
                auVar61._0_4_ = uVar22;
                auVar61._8_4_ = uVar22;
                auVar61._12_4_ = uVar22;
                auVar80 = vfmadd231ps_fma(auVar34,auVar10,auVar51);
                uVar22 = *(undefined4 *)((uVar25 - 0x80) + lVar26 * 4);
                auVar52._4_4_ = uVar22;
                auVar52._0_4_ = uVar22;
                auVar52._8_4_ = uVar22;
                auVar52._12_4_ = uVar22;
                auVar81 = vfmadd231ps_fma(auVar56,auVar10,auVar47);
                uVar22 = *(undefined4 *)((uVar25 - 0x60) + lVar26 * 4);
                auVar48._4_4_ = uVar22;
                auVar48._0_4_ = uVar22;
                auVar48._8_4_ = uVar22;
                auVar48._12_4_ = uVar22;
                auVar34 = vfmadd231ps_fma(auVar55,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar61);
                auVar56 = vfmadd231ps_fma(auVar70,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar52);
                auVar55 = vfmadd231ps_fma(auVar73,auVar48,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar54 = vandps_avx(auVar74,auVar34);
                auVar85._8_4_ = 0x219392ef;
                auVar85._0_8_ = 0x219392ef219392ef;
                auVar85._12_4_ = 0x219392ef;
                auVar54 = vcmpps_avx(auVar54,auVar85,1);
                auVar34 = vblendvps_avx(auVar34,auVar85,auVar54);
                auVar54 = vandps_avx(auVar74,auVar56);
                auVar54 = vcmpps_avx(auVar54,auVar85,1);
                auVar56 = vblendvps_avx(auVar56,auVar85,auVar54);
                auVar54 = vandps_avx(auVar55,auVar74);
                auVar54 = vcmpps_avx(auVar54,auVar85,1);
                auVar54 = vblendvps_avx(auVar55,auVar85,auVar54);
                auVar55 = vrcpps_avx(auVar34);
                auVar82._8_4_ = 0x3f800000;
                auVar82._0_8_ = 0x3f8000003f800000;
                auVar82._12_4_ = 0x3f800000;
                auVar34 = vfnmadd213ps_fma(auVar34,auVar55,auVar82);
                auVar55 = vfmadd132ps_fma(auVar34,auVar55,auVar55);
                auVar34 = vrcpps_avx(auVar56);
                auVar56 = vfnmadd213ps_fma(auVar56,auVar34,auVar82);
                auVar56 = vfmadd132ps_fma(auVar56,auVar34,auVar34);
                auVar34 = vrcpps_avx(auVar54);
                auVar54 = vfnmadd213ps_fma(auVar54,auVar34,auVar82);
                auVar54 = vfmadd132ps_fma(auVar54,auVar34,auVar34);
                auVar9._4_4_ = tray.org.field_0._4_4_;
                auVar9._0_4_ = tray.org.field_0._0_4_;
                auVar9._8_4_ = tray.org.field_0._8_4_;
                auVar9._12_4_ = tray.org.field_0._12_4_;
                auVar34 = vfmadd231ps_fma(auVar78,auVar9,auVar61);
                auVar70 = vfmadd231ps_fma(auVar80,auVar9,auVar52);
                auVar73 = vfmadd231ps_fma(auVar81,auVar9,auVar48);
                auVar42._0_4_ = auVar34._0_4_ * -auVar55._0_4_;
                auVar42._4_4_ = auVar34._4_4_ * -auVar55._4_4_;
                auVar42._8_4_ = auVar34._8_4_ * -auVar55._8_4_;
                auVar42._12_4_ = auVar34._12_4_ * -auVar55._12_4_;
                auVar37._0_4_ = auVar70._0_4_ * -auVar56._0_4_;
                auVar37._4_4_ = auVar70._4_4_ * -auVar56._4_4_;
                auVar37._8_4_ = auVar70._8_4_ * -auVar56._8_4_;
                auVar37._12_4_ = auVar70._12_4_ * -auVar56._12_4_;
                auVar33._0_4_ = auVar73._0_4_ * -auVar54._0_4_;
                auVar33._4_4_ = auVar73._4_4_ * -auVar54._4_4_;
                auVar33._8_4_ = auVar73._8_4_ * -auVar54._8_4_;
                auVar33._12_4_ = auVar73._12_4_ * -auVar54._12_4_;
                auVar49._0_4_ = auVar55._0_4_ + auVar42._0_4_;
                auVar49._4_4_ = auVar55._4_4_ + auVar42._4_4_;
                auVar49._8_4_ = auVar55._8_4_ + auVar42._8_4_;
                auVar49._12_4_ = auVar55._12_4_ + auVar42._12_4_;
                auVar53._0_4_ = auVar56._0_4_ + auVar37._0_4_;
                auVar53._4_4_ = auVar56._4_4_ + auVar37._4_4_;
                auVar53._8_4_ = auVar56._8_4_ + auVar37._8_4_;
                auVar53._12_4_ = auVar56._12_4_ + auVar37._12_4_;
                auVar62._0_4_ = auVar54._0_4_ + auVar33._0_4_;
                auVar62._4_4_ = auVar54._4_4_ + auVar33._4_4_;
                auVar62._8_4_ = auVar54._8_4_ + auVar33._8_4_;
                auVar62._12_4_ = auVar54._12_4_ + auVar33._12_4_;
              }
              auVar54 = vpminsd_avx(auVar42,auVar49);
              auVar34 = vpminsd_avx(auVar37,auVar53);
              auVar54 = vpmaxsd_avx(auVar54,auVar34);
              auVar34 = vpminsd_avx(auVar33,auVar62);
              auVar56 = vpmaxsd_avx(auVar54,auVar34);
              auVar54 = vpmaxsd_avx(auVar42,auVar49);
              auVar34 = vpmaxsd_avx(auVar37,auVar53);
              auVar34 = vpminsd_avx(auVar54,auVar34);
              auVar54 = vpmaxsd_avx(auVar33,auVar62);
              auVar34 = vpminsd_avx(auVar34,auVar54);
              auVar54 = vpmaxsd_avx(auVar56,(undefined1  [16])tray.tnear.field_0);
              auVar34 = vpminsd_avx(auVar34,(undefined1  [16])tray.tfar.field_0);
              auVar34 = vcmpps_avx(auVar54,auVar34,2);
              sVar18 = sVar27;
              auVar54 = auVar44;
              if (((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar34[0xf] < '\0') &&
                 (auVar54 = vblendvps_avx(auVar88._0_16_,auVar56,auVar34), sVar18 = sVar3,
                 sVar27 != 8)) {
                pNVar30->ptr = sVar27;
                pNVar30 = pNVar30 + 1;
                *(undefined1 (*) [16])paVar29->v = auVar44;
                paVar29 = paVar29 + 1;
              }
              auVar44 = auVar54;
              sVar27 = sVar18;
            }
            if (sVar27 == 8) goto LAB_01644e45;
            auVar54 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar44,6);
            uVar22 = vmovmskps_avx(auVar54);
            root.ptr = sVar27;
          } while ((byte)uVar24 < (byte)POPCOUNT(uVar22));
          pNVar30->ptr = sVar27;
          pNVar30 = pNVar30 + 1;
          *(undefined1 (*) [16])paVar29->v = auVar44;
          paVar29 = paVar29 + 1;
LAB_01644e45:
          iVar23 = 4;
        }
        else {
          while (uVar25 != 0) {
            sVar27 = 0;
            for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              sVar27 = sVar27 + 1;
            }
            uVar25 = uVar25 - 1 & uVar25;
            bVar20 = occluded1(This,bvh,root,sVar27,&pre,ray,&tray,context);
            if (bVar20) {
              terminated.field_0.i[sVar27] = -1;
            }
          }
          auVar44 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          auVar88 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar89 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            auVar44._8_4_ = 0xff800000;
            auVar44._0_8_ = 0xff800000ff800000;
            auVar44._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar44,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
          if (uVar24 < uVar21) goto LAB_01644b24;
        }
      } while (iVar23 != 3);
LAB_0164502e:
      auVar44 = vandps_avx(auVar38,(undefined1  [16])terminated.field_0);
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      auVar44 = vmaskmovps_avx(auVar44,auVar38);
      *(undefined1 (*) [16])(ray + 0x80) = auVar44;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }